

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

void __thiscall
slang::ast::PredefinedIntegerType::PredefinedIntegerType
          (PredefinedIntegerType *this,Kind integerKind)

{
  PredefinedIntegerType(this,integerKind,integerKind < Time);
  return;
}

Assistant:

bool getSigned(PredefinedIntegerType::Kind kind) {
    switch (kind) {
        case PredefinedIntegerType::ShortInt: return true;
        case PredefinedIntegerType::Int: return true;
        case PredefinedIntegerType::LongInt: return true;
        case PredefinedIntegerType::Byte: return true;
        case PredefinedIntegerType::Integer: return true;
        case PredefinedIntegerType::Time: return false;
    }
    SLANG_UNREACHABLE;
}